

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

optional<long>
wallet::MaxInputWeight
          (Descriptor *desc,optional<CTxIn> *txin,CCoinControl *coin_control,bool tx_is_segwit,
          bool can_grind_r)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  _Storage<long,_true> _Var4;
  int extraout_var_00;
  uint extraout_var_01;
  long lVar5;
  _Storage<long,_true> _Var6;
  byte bVar7;
  ulong uVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar9;
  _Storage<long,_true> _Var10;
  undefined8 uVar11;
  undefined3 in_register_00000081;
  long in_FS_OFFSET;
  optional<long> oVar12;
  int extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if (CONCAT31(in_register_00000081,can_grind_r) != 0) {
    if (coin_control == (CCoinControl *)0x0) {
LAB_0023cf98:
      bVar2 = false;
    }
    else if (coin_control->fAllowWatchOnly == false) {
      if ((txin->super__Optional_base<CTxIn,_false,_false>)._M_payload.
          super__Optional_payload<CTxIn,_true,_false,_false>.super__Optional_payload_base<CTxIn>.
          _M_engaged != true) goto LAB_0023cf98;
      bVar2 = CCoinControl::IsExternalSelected(coin_control,(COutPoint *)txin);
    }
  }
  _Var4._0_4_ = (*desc->_vptr_Descriptor[0xd])(desc,(ulong)bVar2);
  _Var4._M_value._4_4_ = extraout_var;
  _Var6 = _Var4;
  if ((extraout_RDX & 1) != 0) {
    _Var6._0_4_ = (*desc->_vptr_Descriptor[0xe])(desc);
    _Var6._M_value._4_4_ = extraout_var_00;
    if ((extraout_RDX_00 & 1) != 0) {
      iVar3 = (*desc->_vptr_Descriptor[0xb])(desc);
      uVar9 = (ulong)extraout_var_01;
      lVar5 = 0xa4;
      bVar7 = iVar3 != 0 & (byte)extraout_var_01;
      if (bVar7 == 0) {
        _Var10._M_value = _Var4._M_value + 3;
        if (-1 < extraout_var) {
          _Var10 = _Var4;
        }
        uVar9 = _Var10._M_value >> 2;
        if ((0xfc < uVar9) && (lVar5 = 0xac, 0xffff < uVar9)) {
          uVar9 = uVar9 >> 0x20;
          lVar5 = (ulong)(uVar9 != 0) * 0x10 + 0xb4;
        }
      }
      if (bVar7 == 0) {
        uVar8 = (ulong)tx_is_segwit;
      }
      else {
        uVar8 = 1;
        if ((0xfc < (ulong)_Var6) && (uVar8 = 3, 0xffff < (ulong)_Var6)) {
          uVar8 = (ulong)(extraout_var_00 != 0) * 4 + 5;
        }
      }
      _Var6._M_value = lVar5 + _Var4._M_value + uVar8;
      uVar11 = CONCAT71((int7)(uVar9 >> 8),1);
      goto LAB_0023d062;
    }
  }
  uVar11 = 0;
LAB_0023d062:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = uVar11;
    oVar12.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var6._M_value;
    return (optional<long>)
           oVar12.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int64_t> MaxInputWeight(const Descriptor& desc, const std::optional<CTxIn>& txin,
                                             const CCoinControl* coin_control, const bool tx_is_segwit,
                                             const bool can_grind_r) {
    if (const auto sat_weight = desc.MaxSatisfactionWeight(!can_grind_r || UseMaxSig(txin, coin_control))) {
        if (const auto elems_count = desc.MaxSatisfactionElems()) {
            const bool is_segwit = IsSegwit(desc);
            // Account for the size of the scriptsig and the number of elements on the witness stack. Note
            // that if any input in the transaction is spending a witness program, we need to specify the
            // witness stack size for every input regardless of whether it is segwit itself.
            // NOTE: this also works in case of mixed scriptsig-and-witness such as in p2sh-wrapped segwit v0
            // outputs. In this case the size of the scriptsig length will always be one (since the redeemScript
            // is always a push of the witness program in this case, which is smaller than 253 bytes).
            const int64_t scriptsig_len = is_segwit ? 1 : GetSizeOfCompactSize(*sat_weight / WITNESS_SCALE_FACTOR);
            const int64_t witstack_len = is_segwit ? GetSizeOfCompactSize(*elems_count) : (tx_is_segwit ? 1 : 0);
            // previous txid + previous vout + sequence + scriptsig len + witstack size + scriptsig or witness
            // NOTE: sat_weight already accounts for the witness discount accordingly.
            return (32 + 4 + 4 + scriptsig_len) * WITNESS_SCALE_FACTOR + witstack_len + *sat_weight;
        }
    }

    return {};
}